

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlSetNsProp(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value)

{
  int iVar1;
  xmlChar *local_60;
  _xmlNode *local_48;
  xmlNodePtr tmp;
  xmlNodePtr children;
  xmlAttrPtr prop;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  if ((ns == (xmlNsPtr)0x0) || (ns->href != (xmlChar *)0x0)) {
    if (name == (xmlChar *)0x0) {
      node_local = (xmlNodePtr)0x0;
    }
    else {
      if (ns == (xmlNsPtr)0x0) {
        local_60 = (xmlChar *)0x0;
      }
      else {
        local_60 = ns->href;
      }
      node_local = (xmlNodePtr)xmlGetPropNodeInternal(node,name,local_60,0);
      if (node_local == (xmlNodePtr)0x0) {
        node_local = (xmlNodePtr)xmlNewPropInternal(node,ns,name,value,0);
      }
      else {
        tmp = (xmlNodePtr)0x0;
        if ((value == (xmlChar *)0x0) ||
           (tmp = xmlNewDocText(node->doc,value), tmp != (xmlNodePtr)0x0)) {
          if (*(xmlAttributeType *)&node_local->content == XML_ATTRIBUTE_ID) {
            xmlRemoveID(node->doc,(xmlAttrPtr)node_local);
            *(xmlAttributeType *)&node_local->content = XML_ATTRIBUTE_ID;
          }
          if (node_local->children != (_xmlNode *)0x0) {
            xmlFreeNodeList(node_local->children);
          }
          node_local->children = (_xmlNode *)0x0;
          node_local->last = (_xmlNode *)0x0;
          node_local->ns = ns;
          if (value != (xmlChar *)0x0) {
            node_local->children = tmp;
            node_local->last = (_xmlNode *)0x0;
            for (local_48 = node_local->children; local_48 != (_xmlNode *)0x0;
                local_48 = local_48->next) {
              local_48->parent = node_local;
              if (local_48->next == (_xmlNode *)0x0) {
                node_local->last = local_48;
              }
            }
          }
          if ((*(int *)&node_local->content == 2) &&
             (iVar1 = xmlAddIDSafe((xmlAttrPtr)node_local,value), iVar1 < 0)) {
            node_local = (xmlNodePtr)0x0;
          }
        }
        else {
          node_local = (xmlNodePtr)0x0;
        }
      }
    }
  }
  else {
    node_local = (xmlNodePtr)0x0;
  }
  return (xmlAttrPtr)node_local;
}

Assistant:

xmlAttrPtr
xmlSetNsProp(xmlNodePtr node, xmlNsPtr ns, const xmlChar *name,
	     const xmlChar *value)
{
    xmlAttrPtr prop;

    if (ns && (ns->href == NULL))
	return(NULL);
    if (name == NULL)
        return(NULL);
    prop = xmlGetPropNodeInternal(node, name,
                                  (ns != NULL) ? ns->href : NULL, 0);
    if (prop != NULL) {
        xmlNodePtr children = NULL;

	/*
	* Modify the attribute's value.
	*/
        if (value != NULL) {
	    children = xmlNewDocText(node->doc, value);
            if (children == NULL)
                return(NULL);
        }

	if (prop->atype == XML_ATTRIBUTE_ID) {
	    xmlRemoveID(node->doc, prop);
	    prop->atype = XML_ATTRIBUTE_ID;
	}
	if (prop->children != NULL)
	    xmlFreeNodeList(prop->children);
	prop->children = NULL;
	prop->last = NULL;
	prop->ns = ns;
	if (value != NULL) {
	    xmlNodePtr tmp;

	    prop->children = children;
	    prop->last = NULL;
	    tmp = prop->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) prop;
		if (tmp->next == NULL)
		    prop->last = tmp;
		tmp = tmp->next;
	    }
	}
	if ((prop->atype == XML_ATTRIBUTE_ID) &&
	    (xmlAddIDSafe(prop, value) < 0)) {
            return(NULL);
        }
	return(prop);
    }
    /*
    * No equal attr found; create a new one.
    */
    return(xmlNewPropInternal(node, ns, name, value, 0));
}